

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarmath_p.h
# Opt level: O0

R_conflict6 QRomanCalendrical::yearMonthToYearDays(int year,int month)

{
  R_conflict6 RVar1;
  uint uVar2;
  int in_ESI;
  int in_EDI;
  undefined4 local_14;
  uint a;
  
  local_14 = in_EDI;
  if (in_EDI < 0) {
    local_14 = in_EDI + 1;
  }
  if (in_ESI + -3 < 0) {
    local_14 = local_14 + -1;
  }
  a = local_14 >> 0x1f;
  uVar2 = QRoundingDown::qDiv<5u,unsigned_int>(a);
  RVar1.year._4_4_ = a;
  RVar1.year._0_4_ = local_14;
  RVar1.days._0_4_ = uVar2;
  RVar1.days._4_4_ = 0;
  return RVar1;
}

Assistant:

constexpr auto yearMonthToYearDays(int year, int month)
{
    // Pre-digests year and month to (possibly denormal) year count and day-within-year.
    struct R { qint64 year; qint64 days; };
    if (year < 0) // Represent -N BCE as 1-N so year numbering is contiguous.
        ++year;
    month -= 3; // Adjust month numbering so March = 0, ...
    if (month < 0) { // and Jan = 10, Feb = 11, in the previous year.
        --year;
        month += 12;
    }
    return R { year, QRoundingDown::qDiv<5>(FiveMonths * month + 2) };
}